

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *cur,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
              out,bool metacolon)

{
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_00;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pcVar4;
  size_type sVar5;
  const_reference pvVar6;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_00;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *in_RDI;
  undefined1 in_R8B;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  in_stack_00000000;
  undefined1 auVar7 [16];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000018;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000090;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000098;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_000000a0;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  in_stack_000000b0;
  noop_output_iterator<char> noop;
  int sub;
  int max;
  traits<char> *in_stack_fffffffffffffdd8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde0;
  difference_type __n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffde8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined7 in_stack_fffffffffffffdf0;
  char in_stack_fffffffffffffdf7;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_1d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  traits<char> *local_1b8;
  unsigned_long in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  error_type in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined1 cond;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_188;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180 [5];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  traits<char> *local_150;
  difference_type local_148;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_120;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  traits<char> *local_108;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8;
  traits<char> *in_stack_ffffffffffffff30;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar8;
  undefined1 metacolon_00;
  undefined4 uVar9;
  undefined3 in_stack_ffffffffffffffe4;
  transform_op tVar10;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_01;
  
  tVar10 = CONCAT13(in_R8B,in_stack_ffffffffffffffe4) & 0x1ffffff;
  uVar9 = 0;
  uVar8 = 0;
  end_01._M_current = (char *)in_RSI;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (!bVar1) {
      (in_RDI->out_).container =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           in_stack_00000000.traits_;
      in_RDI->traits_ = in_stack_00000000._16_8_;
      *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        **)&in_RDI->next_ = in_stack_00000018;
      return in_RDI;
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_RDX);
    cond = (undefined1)((uint)in_stack_fffffffffffffe74 >> 0x18);
    auVar7 = in_stack_00000000._8_16_;
    end_00._M_current = (char *)(ulong)((int)*pcVar4 - 0x24);
    switch(end_00._M_current) {
    case (char *)0x0:
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_RDX);
      in_stack_fffffffffffffdd8 = in_stack_00000000.traits_;
      in_stack_fffffffffffffde0 = in_stack_00000000._16_8_;
      out_01.traits_._0_4_ = in_stack_ffffffffffffffd8;
      out_01.out_.container =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           in_stack_ffffffffffffffd0;
      out_01.traits_._4_4_ = uVar8;
      out_01.next_ = uVar9;
      out_01.rest_ = tVar10;
      format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                (in_RCX,in_stack_00000018,in_stack_ffffffffffffffc0,out_01);
      in_stack_fffffffffffffde8 = in_stack_00000018;
      in_stack_00000018 = in_stack_ffffffffffffffd0;
      break;
    case (char *)0x4:
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_RDX);
      in_stack_fffffffffffffdd8 = in_stack_00000000.traits_;
      in_stack_fffffffffffffde0 = in_stack_00000000._16_8_;
      local_f8 = in_stack_00000018;
      in_stack_fffffffffffffde8 = in_stack_00000018;
      local_108 = in_stack_fffffffffffffdd8;
      local_100 = in_stack_fffffffffffffde0;
      format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                (in_RDX,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(tVar10,uVar9),end_01,in_stack_00000000,
                 SUB41((uint)uVar8 >> 0x18,0));
      in_stack_00000018 = local_d8;
      local_110 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(in_stack_fffffffffffffde8,(difference_type)in_stack_fffffffffffffde0);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_110);
      detail::ensure_(SUB41((uint)in_stack_fffffffffffffe74 >> 0x18,0),in_stack_fffffffffffffe70,
                      in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                      in_stack_fffffffffffffe50);
      break;
    case (char *)0x5:
switchD_001878b9_caseD_5:
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_RDX);
      (in_RDI->out_).container = auVar7._0_8_;
      in_RDI->traits_ = auVar7._8_8_;
      *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        **)&in_RDI->next_ = in_stack_00000018;
      return in_RDI;
    case (char *)0x16:
      if ((tVar10 & 0x1000000) != op_none) goto switchD_001878b9_caseD_5;
    default:
      local_1c0 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(in_stack_fffffffffffffde8,
                               (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_1c0);
      in_stack_fffffffffffffdf7 = *pcVar4;
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator++((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                    *)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator*(&local_1d8);
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                  (char)((ulong)in_stack_fffffffffffffde8 >> 0x38));
      break;
    case (char *)0x1b:
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_RDX);
      __gnu_cxx::operator!=
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffde0,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffdd8);
      detail::ensure_((bool)cond,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50)
      ;
      sVar5 = match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x187c76);
      iVar2 = (int)sVar5 + -1;
      this_01 = in_RDX;
      intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator*(&in_RSI->traits_);
      iVar3 = detail::
              toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_RDX,end_00,
                         (traits<char> *)
                         CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                         (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                         (int)in_stack_fffffffffffffde8);
      metacolon_00 = (undefined1)((uint)iVar3 >> 0x18);
      detail::ensure_((bool)cond,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50)
      ;
      pvVar6 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)end_00._M_current,(size_type)in_RDX);
      auVar7 = in_stack_00000000._8_16_;
      if ((pvVar6->matched & 1U) == 0) {
        format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (in_RSI,this_01,in_RCX,1);
        local_180[0] = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator-(in_stack_fffffffffffffde8,
                                   (difference_type)in_stack_fffffffffffffde0);
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_180);
        auVar7 = in_stack_00000000._8_16_;
        if (*pcVar4 == ':') {
          local_1b8 = in_stack_00000000.traits_;
          format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                    (this_01,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT44(tVar10,iVar2),end_01,in_stack_00000000,(bool)metacolon_00);
          in_stack_00000018 = local_188;
        }
      }
      else {
        local_150 = in_stack_00000000.traits_;
        __n = in_stack_00000000._16_8_;
        local_140 = in_stack_00000018;
        this_00 = in_stack_00000018;
        local_148 = __n;
        format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                  (this_01,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(tVar10,iVar2),end_01,in_stack_00000000,(bool)metacolon_00);
        in_stack_00000018 = local_120;
        local_158 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator-(this_00,__n);
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_158);
        if (*pcVar4 == ':') {
          format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                    (in_RSI,this_01,in_RCX,0);
        }
      }
      (in_RDI->out_).container = auVar7._0_8_;
      in_RDI->traits_ = auVar7._8_8_;
      *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        **)&in_RDI->next_ = in_stack_00000018;
      return in_RDI;
    case (char *)0x38:
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_RDX);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffde0,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffdd8);
      if ((bVar1) &&
         (pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_RDX), *pcVar4 == 'g')) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_RDX);
        in_stack_fffffffffffffdd8 = in_stack_00000000.traits_;
        in_stack_fffffffffffffde0 = in_stack_00000000._16_8_;
        out_00.traits_ = (traits<char> *)in_stack_ffffffffffffff58;
        out_00.out_.container =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff50;
        out_00._16_8_ = in_stack_ffffffffffffff60;
        in_stack_fffffffffffffde8 = in_stack_00000018;
        format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                  (in_stack_ffffffffffffff38,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff40,out_00);
        in_stack_00000018 = local_68;
      }
      else {
        in_stack_fffffffffffffdd8 = in_stack_00000000.traits_;
        in_stack_fffffffffffffde0 = in_stack_00000000._16_8_;
        in_stack_ffffffffffffff30 = in_stack_fffffffffffffdd8;
        in_stack_ffffffffffffff38 = in_stack_fffffffffffffde0;
        in_stack_ffffffffffffff40._M_current = (char *)in_stack_00000018;
        format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                  (in_stack_00000098,in_stack_00000090,in_stack_000000a0,in_stack_000000b0);
        in_stack_fffffffffffffde8 = in_stack_00000018;
        in_stack_00000018 = in_stack_ffffffffffffff60;
      }
    }
  } while( true );
}

Assistant:

OutputIterator format_all_impl_(ForwardIterator &cur, ForwardIterator end, OutputIterator out, bool metacolon = false) const
    {
        int max = 0, sub = 0;
        detail::noop_output_iterator<char_type> noop;

        while(cur != end)
        {
            switch(*cur)
            {
            case BOOST_XPR_CHAR_(char_type, '$'):
                out = this->format_backref_(++cur, end, out);
                break;

            case BOOST_XPR_CHAR_(char_type, '\\'):
                if(++cur != end && BOOST_XPR_CHAR_(char_type, 'g') == *cur)
                {
                    out = this->format_named_backref_(++cur, end, out);
                }
                else
                {
                    out = this->format_escape_(cur, end, out);
                }
                break;

            case BOOST_XPR_CHAR_(char_type, '('):
                out = this->format_all_impl_(++cur, end, out);
                BOOST_XPR_ENSURE_(BOOST_XPR_CHAR_(char_type, ')') == *(cur-1)
                  , regex_constants::error_paren, "unbalanced parentheses in format string");
                break;

            case BOOST_XPR_CHAR_(char_type, '?'):
                BOOST_XPR_ENSURE_(++cur != end
                  , regex_constants::error_subreg, "malformed conditional in format string");
                max = static_cast<int>(this->size() - 1);
                sub = detail::toi(cur, end, *this->traits_, 10, max);
                BOOST_XPR_ENSURE_(0 != sub, regex_constants::error_subreg, "invalid back-reference");
                if(this->sub_matches_[ sub ].matched)
                {
                    out = this->format_all_impl_(cur, end, out, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        this->format_all_impl_(cur, end, noop);
                }
                else
                {
                    this->format_all_impl_(cur, end, noop, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        out = this->format_all_impl_(cur, end, out);
                }
                return out;

            case BOOST_XPR_CHAR_(char_type, ':'):
                if(metacolon)
                {
                    BOOST_FALLTHROUGH;
            case BOOST_XPR_CHAR_(char_type, ')'):
                    ++cur;
                    return out;
                }
                BOOST_FALLTHROUGH;

            default:
                *out++ = *cur++;
                break;
            }
        }

        return out;
    }